

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)109,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  Ea<(moira::Mode)6,_1> src;
  Ea<(moira::Mode)6,_1> local_1c;
  
  Op<(moira::Mode)6,1>(&local_1c,this,op & 7,addr);
  cVar4 = 's';
  lVar3 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "psls"[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,&local_1c);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src;
}